

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

int __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>::remove
          (Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
           *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  NodeRef<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
  *pNVar3;
  undefined4 extraout_var;
  Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_> *pNVar4
  ;
  pair<unsigned_long,_float> *in_RDX;
  Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
  *unaff_retaddr;
  size_t level;
  Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_> *pNode;
  SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
  *pSVar5;
  SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
  *this_00;
  int local_8;
  
  bVar1 = duckdb::SkipLess<std::pair<unsigned_long,_float>_>::operator()
                    ((SkipLess<std::pair<unsigned_long,_float>_> *)&this->field_0x30,in_RDX,
                     &this->_value);
  if (bVar1) {
LAB_00a3942c:
    if (((__filename != (char *)0x0) ||
        (bVar1 = duckdb::SkipLess<std::pair<unsigned_long,_float>_>::operator()
                           ((SkipLess<std::pair<unsigned_long,_float>_> *)&this->field_0x30,in_RDX,
                            &this->_value), bVar1)) ||
       (bVar1 = duckdb::SkipLess<std::pair<unsigned_long,_float>_>::operator()
                          ((SkipLess<std::pair<unsigned_long,_float>_> *)&this->field_0x30,
                           &this->_value,in_RDX), bVar1)) {
      local_8 = 0;
    }
    else {
      SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
      ::resetSwapLevel(&this->_nodeRefs);
      local_8 = (int)this;
    }
  }
  else {
    pSVar5 = (SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
              *)(__filename + 1);
    do {
      do {
        this_00 = (SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                   *)((long)&pSVar5[-1]._swapLevel + 7);
        if (pSVar5 == (SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                       *)0x0) goto LAB_00a3942c;
        pNVar3 = SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                 ::operator[](this_00,(size_t)this);
        pSVar5 = this_00;
      } while (pNVar3->pNode ==
               (Node<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
                *)0x0);
      pNVar3 = SwappableNodeRefStack<std::pair<unsigned_long,_float>,_duckdb::SkipLess<std::pair<unsigned_long,_float>_>_>
               ::operator[](this_00,(size_t)this);
      iVar2 = remove(pNVar3->pNode,(char *)this_00);
      pSVar5 = this_00;
    } while (CONCAT44(extraout_var,iVar2) == 0);
    pNVar4 = _adjRemoveRefs(pNode,level,unaff_retaddr);
    local_8 = (int)pNVar4;
  }
  return local_8;
}

Assistant:

Node<T, _Compare> *Node<T, _Compare>::remove(size_t call_level,
                         const T &value) {
    assert(_nodeRefs.height());
    assert(_nodeRefs.noNodePointerMatches(this));

    Node<T, _Compare> *pNode = nullptr;
    // Effectively: if (value >= _value) {
    if (!_compare(value, _value)) {
        for (size_t level = call_level + 1; level-- > 0;) {
            if (_nodeRefs[level].pNode) {
                // Make progress to the right
                pNode = _nodeRefs[level].pNode->remove(level, value);
                if (pNode) {
                    return _adjRemoveRefs(level, pNode);
                }
            }
            // Make progress down
        }
    }
    if (! pNode) { // Base case
        // We only admit to being the node to remove if the caller is
        // approaching us from level 0. It is entirely likely that
        // the same (or an other) caller can see us at a higher level
        // but the recursion stack will not have been set up in the correct
        // step wise fashion so that the lower level references will
        // not be swapped.
        // Effectively: if (call_level == 0 && value == _value) {
        if (call_level == 0 && !_compare(value, _value) && !_compare(_value, value)) {
            _nodeRefs.resetSwapLevel();
            return this;
        }
    }
    assert(pNode == nullptr);
    return nullptr;
}